

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

iterator cs_impl::list_cs_ext::insert(list *lst,iterator *pos,var *val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  any local_30;
  any local_28;
  
  local_30.mDat = val->mDat;
  if (local_30.mDat != (proxy *)0x0) {
    (local_30.mDat)->refcount = (local_30.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&local_28,(EVP_PKEY_CTX *)&local_30);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  p_Var2[1]._M_next = (_List_node_base *)local_28.mDat;
  local_28.mDat = (proxy *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  any::recycle(&local_28);
  any::recycle(&local_30);
  return (iterator)p_Var2;
}

Assistant:

list::iterator insert(list &lst, list::iterator &pos, const var &val)
		{
			return lst.insert(pos, copy(val));
		}